

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPubkey *ext_pubkey,string *child_path,ByteData *finterprint)

{
  allocator local_81;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  ExtPrivkey *local_78;
  Privkey *local_70;
  string local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  local_78 = &this->extprivkey_;
  local_70 = &this->privkey_;
  ExtPrivkey::ExtPrivkey(local_78);
  ExtPubkey::ExtPubkey(&this->extpubkey_,ext_pubkey);
  local_80 = &this->path_;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->fingerprint_,
             &finterprint->data_);
  if (child_path->_M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&local_68,"KeyData",&local_81);
    ToArrayFromString((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,child_path,
                      &local_68,'\0');
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(local_80,&local_48);
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    ::std::__cxx11::string::~string((string *)&local_68);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ext_pubkey->pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_68);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPubkey& ext_pubkey, const std::string& child_path,
    const ByteData& finterprint)
    : extpubkey_(ext_pubkey), fingerprint_(finterprint) {
  if (!child_path.empty()) {
    path_ = ToArrayFromString(child_path, "KeyData", 0);
  }
  pubkey_ = ext_pubkey.GetPubkey();
}